

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::exception<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
          (exception *this,CylHead *args,char (*args_1) [8],int *args_2,char (*args_3) [29],
          int *args_4,char (*args_5) [2])

{
  _Alloc_hider in_stack_ffffffffffffffd0;
  
  make_string<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
            ((string *)&stack0xffffffffffffffd0,(util *)args,(CylHead *)args_1,(char (*) [8])args_2,
             (int *)args_3,(char (*) [29])args_4,(int *)args_5,
             (char (*) [2])in_stack_ffffffffffffffd0._M_p);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}